

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

int ly_vlog_build_path_print
              (char **path,uint16_t *index,char *str,uint16_t str_len,uint16_t *length)

{
  char *pcVar1;
  uint local_48;
  uint16_t step;
  void *mem;
  uint16_t *length_local;
  uint16_t str_len_local;
  char *str_local;
  uint16_t *index_local;
  char **path_local;
  
  if (*index < str_len) {
    if (str_len < 0x80) {
      local_48 = 0x80;
    }
    else {
      local_48 = (uint)str_len;
    }
    pcVar1 = (char *)realloc(*path,(long)(int)((uint)*length + (uint)*index + local_48 + 1));
    if (pcVar1 == (char *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "ly_vlog_build_path_print");
      return -1;
    }
    *path = pcVar1;
    memmove(*path + (int)(*index + local_48),*path + *index,(ulong)*length);
    *index = *index + (short)local_48;
  }
  *index = *index - str_len;
  memcpy(*path + *index,str,(ulong)str_len);
  *length = *length + str_len;
  return 0;
}

Assistant:

static int
ly_vlog_build_path_print(char **path, uint16_t *index, const char *str, uint16_t str_len, uint16_t *length)
{
    void *mem;
    uint16_t step;

    if ((*index) < str_len) {
        /* enlarge buffer */
        step = (str_len < LY_BUF_STEP) ? LY_BUF_STEP : str_len;
        mem = realloc(*path, *length + *index + step + 1);
        LY_CHECK_ERR_RETURN(!mem, LOGMEM(NULL), -1);
        *path = mem;

        /* move data, lengths */
        memmove(&(*path)[*index + step], &(*path)[*index], *length);
        (*index) += step;
    }

    (*index) -= str_len;
    memcpy(&(*path)[*index], str, str_len);
    *length += str_len;

    return 0;
}